

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O3

void __thiscall duckdb::CSVErrorHandler::ErrorIfNeeded(CSVErrorHandler *this)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  undefined8 extraout_RAX;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 != 0) {
    ::std::__throw_system_error(iVar2);
  }
  if ((this->ignore_errors == false) &&
     ((this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
      super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
      super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    pvVar3 = vector<duckdb::CSVError,_true>::operator[](&this->errors,0);
    bVar1 = CanGetLine(this,(pvVar3->error_info).boundary_idx);
    if (bVar1) {
      pvVar3 = vector<duckdb::CSVError,_true>::operator[](&this->errors,0);
      ThrowError(this,pvVar3);
      pthread_mutex_unlock((pthread_mutex_t *)this);
      _Unwind_Resume(extraout_RAX);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void CSVErrorHandler::ErrorIfNeeded() {
	lock_guard<mutex> parallel_lock(main_mutex);
	if (ignore_errors || errors.empty()) {
		// Nothing to error
		return;
	}

	if (CanGetLine(errors[0].error_info.boundary_idx)) {
		ThrowError(errors[0]);
	}
}